

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ConvertToNinjaPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *path)

{
  cmGlobalNinjaGenerator *this_00;
  string *psVar1;
  
  this_00 = GetGlobalGenerator(this);
  psVar1 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this_00,path);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertToNinjaPath(const std::string& path) const
  {
    return this->GetGlobalGenerator()->ConvertToNinjaPath(path);
  }